

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O3

int mbedtls_camellia_self_test(int verbose)

{
  ulong uVar1;
  uchar (*pauVar2) [16];
  int iVar3;
  uchar *puVar4;
  uchar (*pauVar5) [48];
  char *pcVar6;
  uint uVar7;
  size_t __n;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  uint uVar12;
  long lVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uchar src [16];
  size_t offset;
  uchar key [32];
  uchar nonce_counter [16];
  uchar iv [16];
  uchar buf [64];
  uchar stream_block [16];
  mbedtls_camellia_context ctx;
  uchar local_208 [32];
  size_t local_1e8;
  size_t local_1e0;
  uchar local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  uchar local_1a8 [8];
  uchar auStack_1a0 [8];
  uchar local_198;
  uchar uStack_197;
  uchar uStack_196;
  uchar uStack_195;
  uchar uStack_194;
  uchar uStack_193;
  uchar uStack_192;
  uchar uStack_191;
  uchar uStack_190;
  uchar uStack_18f;
  uchar uStack_18e;
  uchar uStack_18d;
  uchar uStack_18c;
  uchar uStack_18b;
  uchar uStack_18a;
  uchar uStack_189;
  uchar local_158 [20];
  mbedtls_camellia_context local_144;
  
  local_1d8[0] = '\0';
  local_1d8[1] = '\0';
  local_1d8[2] = '\0';
  local_1d8[3] = '\0';
  local_1d8[4] = '\0';
  local_1d8[5] = '\0';
  local_1d8[6] = '\0';
  local_1d8[7] = '\0';
  local_1d8[8] = '\0';
  local_1d8[9] = '\0';
  local_1d8[10] = '\0';
  local_1d8[0xb] = '\0';
  local_1d8[0xc] = '\0';
  local_1d8[0xd] = '\0';
  local_1d8[0xe] = '\0';
  local_1d8[0xf] = '\0';
  local_1c8 = (undefined1  [16])0x0;
  uVar10 = 0;
  do {
    while( true ) {
      uVar7 = uVar10 >> 1;
      uVar12 = uVar7 * 0x40 + 0x80;
      if (verbose != 0) {
        pcVar6 = "enc";
        if ((uVar10 & 1) == 0) {
          pcVar6 = "dec";
        }
        printf("  CAMELLIA-ECB-%3d (%s): ",(ulong)uVar12,pcVar6);
      }
      local_1e0 = (size_t)(uVar7 * 8 + 0x10);
      lVar9 = 0;
      bVar14 = true;
      do {
        bVar11 = bVar14;
        puVar4 = local_1d8;
        memcpy(puVar4,camellia_test_ecb_key[uVar7] + lVar9,local_1e0);
        if ((uVar10 & 1) == 0) {
          mbedtls_camellia_setkey_dec(&local_144,puVar4,uVar12);
          iVar3 = (int)puVar4;
          pauVar2 = camellia_test_ecb_cipher[uVar7] + lVar9;
          local_208._0_8_ = *(undefined8 *)*pauVar2;
          local_208._8_8_ = *(undefined8 *)(*pauVar2 + 8);
          pauVar2 = camellia_test_ecb_plain;
        }
        else {
          mbedtls_camellia_setkey_enc(&local_144,puVar4,uVar12);
          iVar3 = (int)puVar4;
          local_208._0_8_ = *(undefined8 *)camellia_test_ecb_plain[lVar9];
          local_208._8_8_ = *(undefined8 *)(camellia_test_ecb_plain[lVar9] + 8);
          pauVar2 = camellia_test_ecb_cipher[uVar7];
        }
        local_208._16_8_ = *(undefined8 *)pauVar2[lVar9];
        local_208._24_8_ = *(undefined8 *)(pauVar2[lVar9] + 8);
        mbedtls_camellia_crypt_ecb(&local_144,iVar3,local_208,&local_198);
        auVar15[0] = -(local_198 == local_208[0x10]);
        auVar15[1] = -(uStack_197 == local_208[0x11]);
        auVar15[2] = -(uStack_196 == local_208[0x12]);
        auVar15[3] = -(uStack_195 == local_208[0x13]);
        auVar15[4] = -(uStack_194 == local_208[0x14]);
        auVar15[5] = -(uStack_193 == local_208[0x15]);
        auVar15[6] = -(uStack_192 == local_208[0x16]);
        auVar15[7] = -(uStack_191 == local_208[0x17]);
        auVar15[8] = -(uStack_190 == local_208[0x18]);
        auVar15[9] = -(uStack_18f == local_208[0x19]);
        auVar15[10] = -(uStack_18e == local_208[0x1a]);
        auVar15[0xb] = -(uStack_18d == local_208[0x1b]);
        auVar15[0xc] = -(uStack_18c == local_208[0x1c]);
        auVar15[0xd] = -(uStack_18b == local_208[0x1d]);
        auVar15[0xe] = -(uStack_18a == local_208[0x1e]);
        auVar15[0xf] = -(uStack_189 == local_208[0x1f]);
        if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar15[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00105697;
        lVar9 = 1;
        bVar14 = false;
      } while (bVar11);
      if (verbose == 0) break;
      puts("passed");
      uVar10 = uVar10 + 1;
      if (uVar10 == 6) {
        putchar(10);
        goto LAB_00105382;
      }
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != 6);
LAB_00105382:
  uVar10 = 0;
  do {
    while( true ) {
      uVar7 = uVar10 >> 1;
      if (verbose != 0) {
        pcVar6 = "enc";
        if ((uVar10 & 1) == 0) {
          pcVar6 = "dec";
        }
        printf("  CAMELLIA-CBC-%3d (%s): ",(ulong)(uVar7 * 0x40 + 0x80),pcVar6);
      }
      local_208[0] = '\0';
      local_208[1] = '\x01';
      local_208[2] = '\x02';
      local_208[3] = '\x03';
      local_208[4] = '\x04';
      local_208[5] = '\x05';
      local_208[6] = '\x06';
      local_208[7] = '\a';
      local_208[8] = '\b';
      local_208[9] = '\t';
      local_208[10] = '\n';
      local_208[0xb] = '\v';
      local_208[0xc] = '\f';
      local_208[0xd] = '\r';
      local_208[0xe] = '\x0e';
      local_208[0xf] = '\x0f';
      local_208[0x10] = '\0';
      local_208[0x11] = '\x01';
      local_208[0x12] = '\x02';
      local_208[0x13] = '\x03';
      local_208[0x14] = '\x04';
      local_208[0x15] = '\x05';
      local_208[0x16] = '\x06';
      local_208[0x17] = '\a';
      local_208[0x18] = '\b';
      local_208[0x19] = '\t';
      local_208[0x1a] = '\n';
      local_208[0x1b] = '\v';
      local_208[0x1c] = '\f';
      local_208[0x1d] = '\r';
      local_208[0x1e] = '\x0e';
      local_208[0x1f] = '\x0f';
      memcpy(local_1d8,camellia_test_cbc_key + uVar7,(ulong)(uVar7 * 8 + 0x10));
      uVar12 = uVar7 * 0x40 + 0x80;
      if ((uVar10 & 1) == 0) {
        mbedtls_camellia_setkey_dec(&local_144,local_1d8,uVar12);
      }
      else {
        mbedtls_camellia_setkey_enc(&local_144,local_1d8,uVar12);
      }
      lVar13 = 0;
      lVar9 = 0;
      do {
        bVar14 = (uVar10 & 1) != 0;
        if (bVar14) {
          local_1a8[0] = local_208[0x10];
          local_1a8[1] = local_208[0x11];
          local_1a8[2] = local_208[0x12];
          local_1a8[3] = local_208[0x13];
          local_1a8[4] = local_208[0x14];
          local_1a8[5] = local_208[0x15];
          local_1a8[6] = local_208[0x16];
          local_1a8[7] = local_208[0x17];
          auStack_1a0[0] = local_208[0x18];
          auStack_1a0[1] = local_208[0x19];
          auStack_1a0[2] = local_208[0x1a];
          auStack_1a0[3] = local_208[0x1b];
          auStack_1a0[4] = local_208[0x1c];
          auStack_1a0[5] = local_208[0x1d];
          auStack_1a0[6] = local_208[0x1e];
          auStack_1a0[7] = local_208[0x1f];
          local_208._0_8_ = *(undefined8 *)(camellia_test_cbc_plain[0] + lVar13);
          local_208._8_8_ = *(undefined8 *)(camellia_test_cbc_plain[0] + lVar13 + 8);
          puVar4 = camellia_test_cbc_cipher[uVar7][0] + lVar13;
        }
        else {
          local_1a8[0] = local_208[0];
          local_1a8[1] = local_208[1];
          local_1a8[2] = local_208[2];
          local_1a8[3] = local_208[3];
          local_1a8[4] = local_208[4];
          local_1a8[5] = local_208[5];
          local_1a8[6] = local_208[6];
          local_1a8[7] = local_208[7];
          auStack_1a0[0] = local_208[8];
          auStack_1a0[1] = local_208[9];
          auStack_1a0[2] = local_208[10];
          auStack_1a0[3] = local_208[0xb];
          auStack_1a0[4] = local_208[0xc];
          auStack_1a0[5] = local_208[0xd];
          auStack_1a0[6] = local_208[0xe];
          auStack_1a0[7] = local_208[0xf];
          puVar4 = camellia_test_cbc_cipher[uVar7][0] + lVar13;
          local_208._0_8_ = *(undefined8 *)puVar4;
          local_208._8_8_ = *(undefined8 *)(puVar4 + 8);
          puVar4 = camellia_test_cbc_plain[lVar9];
        }
        local_208._16_8_ = *(undefined8 *)puVar4;
        local_208._24_8_ = *(undefined8 *)(puVar4 + 8);
        mbedtls_camellia_crypt_cbc(&local_144,(uint)bVar14,0x10,local_1a8,local_208,&local_198);
        auVar16[0] = -(local_198 == local_208[0x10]);
        auVar16[1] = -(uStack_197 == local_208[0x11]);
        auVar16[2] = -(uStack_196 == local_208[0x12]);
        auVar16[3] = -(uStack_195 == local_208[0x13]);
        auVar16[4] = -(uStack_194 == local_208[0x14]);
        auVar16[5] = -(uStack_193 == local_208[0x15]);
        auVar16[6] = -(uStack_192 == local_208[0x16]);
        auVar16[7] = -(uStack_191 == local_208[0x17]);
        auVar16[8] = -(uStack_190 == local_208[0x18]);
        auVar16[9] = -(uStack_18f == local_208[0x19]);
        auVar16[10] = -(uStack_18e == local_208[0x1a]);
        auVar16[0xb] = -(uStack_18d == local_208[0x1b]);
        auVar16[0xc] = -(uStack_18c == local_208[0x1c]);
        auVar16[0xd] = -(uStack_18b == local_208[0x1d]);
        auVar16[0xe] = -(uStack_18a == local_208[0x1e]);
        auVar16[0xf] = -(uStack_189 == local_208[0x1f]);
        if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar16[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00105697;
        lVar9 = lVar9 + 1;
        lVar13 = lVar13 + 0x10;
      } while (lVar13 != 0x30);
      if (verbose != 0) break;
      uVar10 = uVar10 + 1;
      if (uVar10 == 6) {
LAB_00105527:
        uVar8 = 0;
        while( true ) {
          if (verbose != 0) {
            pcVar6 = "enc";
            if ((uVar8 & 1) == 0) {
              pcVar6 = "dec";
            }
            printf("  CAMELLIA-CTR-128 (%s): ",pcVar6);
          }
          uVar1 = uVar8 >> 1;
          local_1b8 = *(undefined8 *)camellia_test_ctr_nonce_counter[uVar1];
          uStack_1b0 = *(undefined8 *)(camellia_test_ctr_nonce_counter[uVar1] + 8);
          local_1d8 = camellia_test_ctr_key[uVar1];
          local_1e8 = 0;
          mbedtls_camellia_setkey_enc(&local_144,local_1d8,0x80);
          __n = (size_t)camellia_test_ctr_len[uVar1];
          if ((uVar8 & 1) == 0) {
            memcpy(&local_198,camellia_test_ctr_ct + uVar1,__n);
            mbedtls_camellia_crypt_ctr
                      (&local_144,__n,&local_1e8,(uchar *)&local_1b8,local_158,&local_198,&local_198
                      );
            pauVar5 = camellia_test_ctr_pt;
          }
          else {
            memcpy(&local_198,camellia_test_ctr_pt + uVar1,__n);
            mbedtls_camellia_crypt_ctr
                      (&local_144,__n,&local_1e8,(uchar *)&local_1b8,local_158,&local_198,&local_198
                      );
            pauVar5 = camellia_test_ctr_ct;
          }
          iVar3 = bcmp(&local_198,pauVar5 + uVar1,__n);
          if (iVar3 != 0) break;
          if (verbose == 0) {
            uVar10 = (int)uVar8 + 1;
            uVar8 = (ulong)uVar10;
            if (uVar10 == 6) {
              return 0;
            }
          }
          else {
            puts("passed");
            uVar10 = (int)uVar8 + 1;
            uVar8 = (ulong)uVar10;
            if (uVar10 == 6) {
              putchar(10);
              return 0;
            }
          }
        }
LAB_00105697:
        if (verbose == 0) {
          return 1;
        }
        puts("failed");
        return 1;
      }
    }
    puts("passed");
    uVar10 = uVar10 + 1;
  } while (uVar10 != 6);
  putchar(10);
  goto LAB_00105527;
}

Assistant:

int mbedtls_camellia_self_test( int verbose )
{
    int i, j, u, v;
    unsigned char key[32];
    unsigned char buf[64];
    unsigned char src[16];
    unsigned char dst[16];
#if defined(MBEDTLS_CIPHER_MODE_CBC)
    unsigned char iv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR)
    size_t offset, len;
    unsigned char nonce_counter[16];
    unsigned char stream_block[16];
#endif

    mbedtls_camellia_context ctx;

    memset( key, 0, 32 );

    for( j = 0; j < 6; j++ ) {
        u = j >> 1;
    v = j & 1;

    if( verbose != 0 )
        mbedtls_printf( "  CAMELLIA-ECB-%3d (%s): ", 128 + u * 64,
                         (v == MBEDTLS_CAMELLIA_DECRYPT) ? "dec" : "enc");

    for( i = 0; i < CAMELLIA_TESTS_ECB; i++ ) {
        memcpy( key, camellia_test_ecb_key[u][i], 16 + 8 * u );

        if( v == MBEDTLS_CAMELLIA_DECRYPT ) {
            mbedtls_camellia_setkey_dec( &ctx, key, 128 + u * 64 );
            memcpy( src, camellia_test_ecb_cipher[u][i], 16 );
            memcpy( dst, camellia_test_ecb_plain[i], 16 );
        } else { /* MBEDTLS_CAMELLIA_ENCRYPT */
            mbedtls_camellia_setkey_enc( &ctx, key, 128 + u * 64 );
            memcpy( src, camellia_test_ecb_plain[i], 16 );
            memcpy( dst, camellia_test_ecb_cipher[u][i], 16 );
        }

        mbedtls_camellia_crypt_ecb( &ctx, v, src, buf );

        if( memcmp( buf, dst, 16 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    /*
     * CBC mode
     */
    for( j = 0; j < 6; j++ )
    {
        u = j >> 1;
        v = j  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  CAMELLIA-CBC-%3d (%s): ", 128 + u * 64,
                             ( v == MBEDTLS_CAMELLIA_DECRYPT ) ? "dec" : "enc" );

        memcpy( src, camellia_test_cbc_iv, 16 );
        memcpy( dst, camellia_test_cbc_iv, 16 );
        memcpy( key, camellia_test_cbc_key[u], 16 + 8 * u );

        if( v == MBEDTLS_CAMELLIA_DECRYPT ) {
            mbedtls_camellia_setkey_dec( &ctx, key, 128 + u * 64 );
        } else {
            mbedtls_camellia_setkey_enc( &ctx, key, 128 + u * 64 );
        }

        for( i = 0; i < CAMELLIA_TESTS_CBC; i++ ) {

            if( v == MBEDTLS_CAMELLIA_DECRYPT ) {
                memcpy( iv , src, 16 );
                memcpy( src, camellia_test_cbc_cipher[u][i], 16 );
                memcpy( dst, camellia_test_cbc_plain[i], 16 );
            } else { /* MBEDTLS_CAMELLIA_ENCRYPT */
                memcpy( iv , dst, 16 );
                memcpy( src, camellia_test_cbc_plain[i], 16 );
                memcpy( dst, camellia_test_cbc_cipher[u][i], 16 );
            }

            mbedtls_camellia_crypt_cbc( &ctx, v, 16, iv, src, buf );

            if( memcmp( buf, dst, 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }
#endif /* MBEDTLS_CIPHER_MODE_CBC */

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CTR)
    /*
     * CTR mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  CAMELLIA-CTR-128 (%s): ",
                             ( v == MBEDTLS_CAMELLIA_DECRYPT ) ? "dec" : "enc" );

        memcpy( nonce_counter, camellia_test_ctr_nonce_counter[u], 16 );
        memcpy( key, camellia_test_ctr_key[u], 16 );

        offset = 0;
        mbedtls_camellia_setkey_enc( &ctx, key, 128 );

        if( v == MBEDTLS_CAMELLIA_DECRYPT )
        {
            len = camellia_test_ctr_len[u];
            memcpy( buf, camellia_test_ctr_ct[u], len );

            mbedtls_camellia_crypt_ctr( &ctx, len, &offset, nonce_counter, stream_block,
                                buf, buf );

            if( memcmp( buf, camellia_test_ctr_pt[u], len ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }
        }
        else
        {
            len = camellia_test_ctr_len[u];
            memcpy( buf, camellia_test_ctr_pt[u], len );

            mbedtls_camellia_crypt_ctr( &ctx, len, &offset, nonce_counter, stream_block,
                                buf, buf );

            if( memcmp( buf, camellia_test_ctr_ct[u], len ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CTR */

    return( 0 );
}